

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppcVar7;
  reference pbVar8;
  const_reference pvVar9;
  string local_260;
  undefined1 local_240 [8];
  GeneratorInfo info_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  const_iterator a;
  string local_1a0;
  string local_180;
  undefined1 local_160 [8];
  GeneratorInfo info_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  const_iterator gen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  const_iterator e_1;
  const_iterator i_1;
  GeneratorInfo info;
  size_t j;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  const_iterator e;
  const_iterator i;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators_local;
  cmake *this_local;
  
  e = std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::begin
                (&this->Generators);
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ::end(&this->Generators);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&e,(__normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                           *)&names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&e);
    (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[4])
              (*ppcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_40);
    info.supportsToolset = false;
    info.supportsPlatform = false;
    info.isAlias = false;
    info._99_5_ = 0;
    while( true ) {
      uVar1 = info._96_8_;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if (sVar5 <= (ulong)uVar1) break;
      GeneratorInfo::GeneratorInfo((GeneratorInfo *)&i_1);
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                ::operator*(&e);
      iVar3 = (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[5])();
      info.extraName.field_2._M_local_buf[8] = (byte)iVar3 & 1;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                ::operator*(&e);
      iVar3 = (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[6])();
      info.extraName.field_2._M_local_buf[9] = (byte)iVar3 & 1;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,info._96_8_);
      std::__cxx11::string::operator=((string *)&i_1,(string *)pvVar6);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,info._96_8_);
      std::__cxx11::string::operator=
                ((string *)(info.name.field_2._M_local_buf + 8),(string *)pvVar6);
      info.extraName.field_2._M_local_buf[10] = '\0';
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(value_type *)&i_1);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)&i_1);
      info._96_8_ = info._96_8_ + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&e);
  }
  e_1 = std::
        vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
        ::begin(&this->ExtraGenerators);
  genList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                ::end(&this->ExtraGenerators);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&e_1,(__normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
                             *)&genList.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
              ::operator*(&e_1);
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gen,*ppcVar7);
    local_f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gen);
    while( true ) {
      info_1._96_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gen);
      bVar2 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&info_1.supportsToolset);
      if (!bVar2) break;
      GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_160);
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_f0);
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
                ::operator*(&e_1);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_1a0,*ppcVar7);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_180,pbVar8,&local_1a0);
      std::__cxx11::string::operator=((string *)local_160,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_f0);
      std::__cxx11::string::operator=
                ((string *)(info_1.name.field_2._M_local_buf + 8),(string *)pbVar8);
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
                ::operator*(&e_1);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)&a,*ppcVar7);
      std::__cxx11::string::operator=
                ((string *)(info_1.baseName.field_2._M_local_buf + 8),(string *)&a);
      std::__cxx11::string::~string((string *)&a);
      info_1.extraName.field_2._M_local_buf[9] = '\0';
      info_1.extraName.field_2._M_local_buf[8] = '\0';
      info_1.extraName.field_2._M_local_buf[10] = '\0';
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(value_type *)local_160);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_160);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_f0);
    }
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
              ::operator*(&e_1);
    local_1d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&(*ppcVar7)->Aliases);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1c8,&local_1d0);
    while( true ) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
                ::operator*(&e_1);
      info_2._96_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(*ppcVar7)->Aliases);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1c8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&info_2.supportsToolset);
      if (!bVar2) break;
      GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_240);
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1c8);
      std::__cxx11::string::operator=((string *)local_240,(string *)pbVar8);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gen);
      if (!bVar2) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gen,0);
        std::__cxx11::string::operator=
                  ((string *)(info_2.name.field_2._M_local_buf + 8),(string *)pvVar9);
      }
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
                ::operator*(&e_1);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_260,*ppcVar7);
      std::__cxx11::string::operator=
                ((string *)(info_2.baseName.field_2._M_local_buf + 8),(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      info_2.extraName.field_2._M_local_buf[9] = '\0';
      info_2.extraName.field_2._M_local_buf[8] = '\0';
      info_2.extraName.field_2._M_local_buf[10] = '\x01';
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(value_type *)local_240);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_240);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1c8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&gen);
    __gnu_cxx::
    __normal_iterator<cmExternalMakefileProjectGeneratorFactory_*const_*,_std::vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>_>
    ::operator++(&e_1);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(
  std::vector<GeneratorInfo>& generators) const
{
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin(),
                                                  e = this->Generators.end();
       i != e; ++i) {
    std::vector<std::string> names;
    (*i)->GetGenerators(names);

    for (size_t j = 0; j < names.size(); ++j) {
      GeneratorInfo info;
      info.supportsToolset = (*i)->SupportsToolset();
      info.supportsPlatform = (*i)->SupportsPlatform();
      info.name = names[j];
      info.baseName = names[j];
      info.isAlias = false;
      generators.push_back(info);
    }
  }

  for (RegisteredExtraGeneratorsVector::const_iterator
         i = this->ExtraGenerators.begin(),
         e = this->ExtraGenerators.end();
       i != e; ++i) {
    const std::vector<std::string> genList =
      (*i)->GetSupportedGlobalGenerators();
    for (std::vector<std::string>::const_iterator gen = genList.begin();
         gen != genList.end(); ++gen) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        *gen, (*i)->GetName());
      info.baseName = *gen;
      info.extraName = (*i)->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(info);
    }
    for (std::vector<std::string>::const_iterator a = (*i)->Aliases.begin();
         a != (*i)->Aliases.end(); ++a) {
      GeneratorInfo info;
      info.name = *a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = (*i)->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(info);
    }
  }
}